

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

word * Extra_NpnRead(char *pFileName,int nFuncs)

{
  word *pwVar1;
  FILE *__stream;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  word *pwVar5;
  char pBuffer [100];
  
  pwVar1 = (word *)calloc((long)nFuncs,8);
  __stream = fopen(pFileName,"rb");
  pwVar5 = pwVar1;
  iVar3 = nFuncs;
  while( true ) {
    pcVar2 = fgets(pBuffer,100,__stream);
    if (pcVar2 == (char *)0x0) break;
    Extra_ReadHex((uint *)pwVar5,pBuffer + (ulong)(pBuffer[1] == 'x') * 2,0x10);
    iVar3 = iVar3 + -1;
    pwVar5 = pwVar5 + 1;
  }
  fclose(__stream);
  if (iVar3 == 0) {
    if (9 < nFuncs) {
      nFuncs = 10;
    }
    if (nFuncs < 1) {
      nFuncs = 0;
    }
    pwVar5 = pwVar1;
    for (uVar4 = 0; (uint)nFuncs != uVar4; uVar4 = uVar4 + 1) {
      printf("Line %d : ",uVar4 & 0xffffffff);
      Extra_PrintHex(_stdout,(uint *)pwVar5,6);
      putchar(10);
      pwVar5 = pwVar5 + 1;
    }
    return pwVar1;
  }
  __assert_fail("i == nFuncs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0x976,"word *Extra_NpnRead(char *, int)");
}

Assistant:

word * Extra_NpnRead( char * pFileName, int nFuncs )
{
    FILE * pFile;
    word * pFuncs;
    char pBuffer[100];
    int i = 0;
    pFuncs = ABC_CALLOC( word, nFuncs );
    pFile = fopen( pFileName, "rb" );
    while ( fgets( pBuffer, 100, pFile ) )
        Extra_ReadHex( (unsigned *)(pFuncs + i++), (pBuffer[1] == 'x' ? pBuffer+2 : pBuffer), 16 );
    fclose( pFile );
    assert( i == nFuncs );
    for ( i = 0; i < Abc_MinInt(nFuncs, 10); i++ )
    {
        printf( "Line %d : ", i );
        Extra_PrintHex( stdout, (unsigned *)(pFuncs + i), 6 ), printf( "\n" );
    }
    return pFuncs;
}